

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_test.cpp
# Opt level: O1

int main_repl(int argc,char **argv)

{
  program_t *value;
  value_t *pvVar1;
  value_t *pvVar2;
  ostream *poVar3;
  source_t source;
  vm_t vm;
  char *local_d0;
  long local_c8;
  char local_c0 [16];
  source_t local_b0;
  vm_t local_98;
  
  deci::vm_t::vm_t(&local_98);
  do {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,">> ",3);
      deci::CompileExpression(&local_b0,"std::cin",(istream *)&std::cin,true);
      value = deci::program_t::Create
                        (local_b0.
                         super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                         (long)local_b0.
                               super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_b0.
                               super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4);
      pvVar1 = deci::vm_t::Run(&local_98,(value_t *)value);
      (*(value->super_function_t).super_value_t._vptr_value_t[3])(value);
      pvVar2 = deci::nothing_t::Instance();
      if (pvVar2 != pvVar1) {
        (*pvVar1->_vptr_value_t[4])(&local_d0,pvVar1);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_d0,local_c8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        if (local_d0 != local_c0) {
          operator_delete(local_d0);
        }
      }
      (*pvVar1->_vptr_value_t[3])(pvVar1);
    } while (local_b0.super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>._M_impl.
             super__Vector_impl_data._M_start == (command_t *)0x0);
    operator_delete(local_b0.super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  } while( true );
}

Assistant:

int main_repl(int argc, char* argv[]) {

  deci::vm_t vm;

  while (true) {
    std::cout << ">> ";

    deci::program_t::source_t source = deci::CompileExpression("std::cin", std::cin, true);
    deci::program_t* prog = deci::program_t::Create(source.data(), source.size());
    deci::value_t* result = vm.Run(*prog);
    prog->Delete();

    if (!result->IsNothing())
    {
      std::cout << result->ToText() << std::endl;
    }
    result->Delete();
  }

  return 0;
}